

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::RepeatedFieldHelper<9>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  int iVar1;
  RepeatedPtrFieldBase *x;
  void *in_RDI;
  int i;
  RepeatedPtrFieldBase *array;
  int iVar2;
  int idx;
  
  x = Get<google::protobuf::internal::RepeatedPtrFieldBase>(in_RDI);
  iVar2 = 0;
  while( true ) {
    idx = iVar2;
    iVar1 = AccessorHelper::Size((RepeatedPtrFieldBase *)0x3dd3bb);
    if (iVar1 <= iVar2) break;
    WriteTagTo<google::protobuf::io::CodedOutputStream>
              ((uint32)((ulong)x >> 0x20),(CodedOutputStream *)CONCAT44(idx,iVar2));
    AccessorHelper::Get(x,idx);
    SerializeTo<9,google::protobuf::io::CodedOutputStream>
              (x,(CodedOutputStream *)CONCAT44(idx,iVar2));
    iVar2 = idx + 1;
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    const internal::RepeatedPtrFieldBase& array =
        Get<internal::RepeatedPtrFieldBase>(field);
    for (int i = 0; i < AccessorHelper::Size(array); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<WireFormatLite::TYPE_STRING>(AccessorHelper::Get(array, i),
                                               output);
    }
  }